

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::
RangeError<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,string *reason,
          _Deque_iterator<long,_long_&,_long_*> *expected_first,
          _Deque_iterator<long,_long_&,_long_*> *expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last,
          _Deque_iterator<long,_long_&,_long_*> *indicate,ptrdiff_t expected_len,ptrdiff_t got_len)

{
  ulong uVar1;
  ostream *poVar2;
  string local_260 [32];
  _Deque_iterator<long,_long_&,_long_*> local_240;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_220;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_218;
  _Deque_iterator<long,_long_&,_long_*> local_210;
  _Deque_iterator<long,_long_&,_long_*> local_1f0;
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  ostringstream local_1b8 [8];
  ostringstream s;
  _Deque_iterator<long,_long_&,_long_*> *expected_last_local;
  _Deque_iterator<long,_long_&,_long_*> *expected_first_local;
  string *reason_local;
  string *msg_local;
  Assert *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_1c0 = stream<std::__cxx11::string>(msg);
    poVar2 = details::operator<<((ostream *)local_1b8,&local_1c0);
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)local_1b8,"Expected range [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected_len);
  poVar2 = std::operator<<(poVar2,"] different");
  poVar2 = std::operator<<(poVar2,(string *)reason);
  poVar2 = std::operator<<(poVar2," to actual range [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,got_len);
  std::operator<<(poVar2,"]\n");
  std::_Deque_iterator<long,_long_&,_long_*>::_Deque_iterator(&local_1f0,expected_first);
  std::_Deque_iterator<long,_long_&,_long_*>::_Deque_iterator(&local_210,expected_last);
  local_220._M_current = got_last._M_current;
  local_218._M_current = got_first._M_current;
  std::_Deque_iterator<long,_long_&,_long_*>::_Deque_iterator(&local_240,indicate);
  OutputRange<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((ostream *)local_1b8,&local_1f0,&local_210,local_218,local_220,&local_240);
  std::__cxx11::ostringstream::str();
  Error(this,local_260);
}

Assistant:

[[noreturn]] void RangeError(const std::string& msg, const std::string& reason, ExpectedIt expected_first,
            ExpectedIt expected_last, GotIterator got_first, GotIterator got_last, ExpectedIt indicate,
            ptrdiff_t expected_len, ptrdiff_t got_len) const {
            auto s = std::ostringstream{};
            if (!msg.empty())
            {
                s << stream(msg) << " ";
            }
            s << "Expected range [" << expected_len << "] different" << reason << " to actual range [" << got_len
              << "]\n";
            OutputRange(s, expected_first, expected_last, got_first, got_last, indicate);
            Error(s.str());
        }